

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

int64_t __thiscall
aeron::archive::AeronArchive::pollForResponse(AeronArchive *this,int64_t correlationId)

{
  element_type *peVar1;
  ClientConductor *this_00;
  Value __val;
  long lVar2;
  int64_t iVar3;
  long *plVar4;
  SourcedException *pSVar5;
  char *pcVar6;
  string *__rhs;
  size_type *psVar7;
  int64_t unaff_R13;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  deadline;
  allocator local_159;
  string local_158;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  string local_58;
  TimePoint local_38;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  local_38.__d.__r = (duration)(lVar2 + (this->messageTimeoutNs_).__r);
  do {
    while( true ) {
      pollNextResponse(this,correlationId,&local_38);
      iVar3 = ControlResponsePoller::controlSessionId
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      if (iVar3 == this->controlSessionId_) break;
LAB_00132349:
      peVar1 = (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1->m_conductorInvoker).m_isRunning == true) {
        this_00 = (peVar1->m_conductorInvoker).m_agent;
        DriverListenerAdapter<aeron::ClientConductor>::receiveMessages
                  (&this_00->m_driverListenerAdapter);
        ClientConductor::onHeartbeatCheckTimeouts(this_00);
      }
    }
    iVar3 = ControlResponsePoller::templateId
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    if (iVar3 != 1) goto LAB_00132349;
    __val = ControlResponsePoller::code
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    if (__val == ERROR) {
      pSVar5 = (SourcedException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_58,correlationId);
      std::operator+(&local_b8,"response for correlation id: ",&local_58);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_158._M_dataplus._M_p = (pointer)*plVar4;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_158._M_dataplus._M_p == psVar7) {
        local_158.field_2._M_allocated_capacity = *psVar7;
        local_158.field_2._8_8_ = plVar4[3];
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar7;
      }
      local_158._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      __rhs = ControlResponsePoller::errorMessage_abi_cxx11_
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      std::operator+(&local_118,&local_158,__rhs);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
      local_138._M_dataplus._M_p = (pointer)*plVar4;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_138._M_dataplus._M_p == psVar7) {
        local_138.field_2._M_allocated_capacity = *psVar7;
        local_138.field_2._8_8_ = plVar4[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar7;
      }
      local_138._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      iVar3 = ControlResponsePoller::relevantId
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      std::__cxx11::to_string(&local_78,iVar3);
      std::operator+(&local_f8,&local_138,&local_78);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,
                 "std::int64_t aeron::archive::AeronArchive::pollForResponse(std::int64_t)","");
      pcVar6 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                         );
      std::__cxx11::string::string((string *)&local_98,pcVar6,&local_159);
      aeron::util::SourcedException::SourcedException(pSVar5,&local_f8,&local_d8,&local_98,0x170);
      *(undefined ***)pSVar5 = &PTR__SourcedException_00164280;
      __cxa_throw(pSVar5,&ArchiveException::typeinfo,
                  aeron::util::SourcedException::~SourcedException);
    }
    iVar3 = ControlResponsePoller::correlationId
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    if (iVar3 == correlationId) {
      if (__val != OK) {
        pSVar5 = (SourcedException *)__cxa_allocate_exception(0x48);
        std::__cxx11::to_string(&local_138,__val);
        std::operator+(&local_f8,"unexpected response: code=",&local_138);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,
                   "std::int64_t aeron::archive::AeronArchive::pollForResponse(std::int64_t)","");
        pcVar6 = aeron::util::past_prefix
                           ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                           );
        std::__cxx11::string::string((string *)&local_158,pcVar6,(allocator *)&local_b8);
        aeron::util::SourcedException::SourcedException
                  (pSVar5,&local_f8,&local_118,&local_158,0x173);
        *(undefined ***)pSVar5 = &PTR__SourcedException_00164280;
        __cxa_throw(pSVar5,&ArchiveException::typeinfo,
                    aeron::util::SourcedException::~SourcedException);
      }
      unaff_R13 = ControlResponsePoller::relevantId
                            ((this->controlResponsePoller_)._M_t.
                             super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                             _M_head_impl);
    }
    if (iVar3 == correlationId) {
      return unaff_R13;
    }
  } while( true );
}

Assistant:

std::int64_t AeronArchive::pollForResponse(std::int64_t correlationId) {
    auto deadline = Clock::now() + messageTimeoutNs_;

    while (true) {
        pollNextResponse(correlationId, deadline);

        if (controlResponsePoller_->controlSessionId() != controlSessionId_ ||
            controlResponsePoller_->templateId() != codecs::ControlResponse::sbeTemplateId()) {
            aeron_->conductorAgentInvoker().invoke();
            continue;
        }

        auto code = controlResponsePoller_->code();
        if (code == codecs::ControlResponseCode::ERROR) {
            throw ArchiveException("response for correlation id: " + std::to_string(correlationId) +
                                       ", error: " + controlResponsePoller_->errorMessage() +
                                       ", relevant id: " + std::to_string(controlResponsePoller_->relevantId()),
                                   SOURCEINFO);
        } else if (correlationId == controlResponsePoller_->correlationId()) {
            if (code != codecs::ControlResponseCode::OK) {
                throw ArchiveException("unexpected response: code=" + std::to_string(code), SOURCEINFO);
            }

            return controlResponsePoller_->relevantId();
        }
    }
}